

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int numBytes)

{
  ostream *poVar1;
  int precision;
  uint uVar2;
  string sStack_1a8;
  ostringstream buf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  uVar2 = (uint)this;
  if ((int)uVar2 < 0x400) {
    poVar1 = (ostream *)std::ostream::operator<<(&buf,uVar2);
    std::operator<<(poVar1," byte(s)");
  }
  else {
    if (uVar2 < 0x100000) {
      de::floatToString_abi_cxx11_(&sStack_1a8,(de *)0x1,(float)(int)uVar2 * 0.0009765625,precision)
      ;
      poVar1 = std::operator<<((ostream *)&buf,(string *)&sStack_1a8);
      std::operator<<(poVar1," KiB");
    }
    else {
      de::floatToString_abi_cxx11_
                (&sStack_1a8,(de *)0x1,(float)(int)uVar2 * 0.0009765625 * 0.0009765625,precision);
      poVar1 = std::operator<<((ostream *)&buf,(string *)&sStack_1a8);
      std::operator<<(poVar1," MiB");
    }
    std::__cxx11::string::~string((string *)&sStack_1a8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

static std::string getHumanReadableByteSize (int numBytes)
{
	std::ostringstream buf;

	if (numBytes < 1024)
		buf << numBytes << " byte(s)";
	else if (numBytes < 1024 * 1024)
		buf << de::floatToString((float)numBytes/1024.0f, 1) << " KiB";
	else
		buf << de::floatToString((float)numBytes/1024.0f/1024.0f, 1) << " MiB";

	return buf.str();
}